

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O2

long __thiscall
gl4cts::anon_unknown_0::NegativeVertexAttribBinding::Run(NegativeVertexAttribBinding *this)

{
  GLenum GVar1;
  CallLogWrapper *this_00;
  char *format;
  GLint p;
  
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8869,&p);
  glu::CallLogWrapper::glVertexAttribBinding(this_00,p + 1,0);
  GVar1 = glu::CallLogWrapper::glGetError(this_00);
  format = "INVALID_VALUE should be generated.\n";
  if (GVar1 == 0x501) {
    glu::CallLogWrapper::glGetIntegerv(this_00,0x82da,&p);
    glu::CallLogWrapper::glVertexAttribBinding(this_00,0,p + 1);
    GVar1 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar1 == 0x501) {
      glu::CallLogWrapper::glBindVertexArray(this_00,0);
      glu::CallLogWrapper::glVertexAttribBinding(this_00,0,0);
      GVar1 = glu::CallLogWrapper::glGetError(this_00);
      if (GVar1 == 0x502) {
        return 0;
      }
      format = "INVALID_OPERATION should be generated.\n";
    }
  }
  anon_unknown_0::Output(format);
  return -1;
}

Assistant:

virtual long Run()
	{
		glBindVertexArray(m_vao);
		GLint p;
		glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &p);
		glVertexAttribBinding(p + 1, 0);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}
		glGetIntegerv(GL_MAX_VERTEX_ATTRIB_BINDINGS, &p);
		glVertexAttribBinding(0, p + 1);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE should be generated.\n");
			return ERROR;
		}
		glBindVertexArray(0);
		glVertexAttribBinding(0, 0);
		if (glGetError() != GL_INVALID_OPERATION)
		{
			Output("INVALID_OPERATION should be generated.\n");
			return ERROR;
		}
		return NO_ERROR;
	}